

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void main_parse_loop(vw *all)

{
  dispatch_fptr local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = thread_dispatch;
  local_28._M_invoker =
       std::_Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
       ::_M_manager;
  parse_dispatch(all,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void main_parse_loop(vw* all) { parse_dispatch(*all, thread_dispatch); }